

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_NtkToAig(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x4dc,"int Abc_NtkToAig(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkHasBlackbox(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasAig(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasMapping(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasBdd(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasSop(pNtk);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                          ,0x4ee,"int Abc_NtkToAig(Abc_Ntk_t *)");
          }
          pNtk_local._4_4_ = Abc_NtkSopToAig(pNtk);
        }
        else {
          iVar1 = Abc_NtkBddToSop(pNtk,-1,1000000000);
          if (iVar1 == 0) {
            pNtk_local._4_4_ = 0;
          }
          else {
            pNtk_local._4_4_ = Abc_NtkSopToAig(pNtk);
          }
        }
      }
      else {
        Abc_NtkMapToSop(pNtk);
        pNtk_local._4_4_ = Abc_NtkSopToAig(pNtk);
      }
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  else {
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkToAig( Abc_Ntk_t * pNtk )
{
    assert( !Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkHasBlackbox(pNtk) )
        return 1;
    if ( Abc_NtkHasAig(pNtk) )
        return 1;
    if ( Abc_NtkHasMapping(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        return Abc_NtkSopToAig(pNtk);
    }
    if ( Abc_NtkHasBdd(pNtk) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
            return 0;
        return Abc_NtkSopToAig(pNtk);
    }
    if ( Abc_NtkHasSop(pNtk) )
        return Abc_NtkSopToAig(pNtk);
    assert( 0 );
    return 0;
}